

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

link_map * get_vdso_from_maps(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  link_map *local_2048;
  link_map *m;
  char *line_pos;
  char line [4096];
  char name [4096];
  Elf64_Addr dynamic;
  Elf64_Addr addr_end;
  Elf64_Addr addr_begin;
  int hit_eof;
  int maps;
  
  addr_begin._4_4_ = 0;
  addr_begin._0_4_ = 0;
  addr_end = 0;
  dynamic = 0;
  memset(line + 0xff8,0,0x1000);
  memset(&line_pos,0,0x1000);
  addr_begin._4_4_ = open("/proc/self/maps",0);
  do {
    do {
      addr_begin._0_4_ = read_line((char *)&line_pos,0x1000,addr_begin._4_4_);
      if ((int)addr_begin != 0) {
        close(addr_begin._4_4_);
        return (link_map *)0x0;
      }
      iVar1 = read_hex((char *)&line_pos,&addr_end);
    } while (*(char *)((long)&line_pos + (long)iVar1) != '-');
    pcVar3 = line + (long)iVar1 + -7;
    iVar1 = read_hex(pcVar3,&dynamic);
    pcVar3 = pcVar3 + iVar1;
    iVar1 = read_word(pcVar3,(char *)0x0,0);
    pcVar3 = pcVar3 + iVar1;
    iVar1 = read_word(pcVar3,(char *)0x0,0);
    pcVar3 = pcVar3 + iVar1;
    iVar1 = read_word(pcVar3,(char *)0x0,0);
    iVar2 = read_word(pcVar3 + iVar1,(char *)0x0,0);
    read_word(pcVar3 + iVar1 + iVar2,line + 0xff8,0x1000);
    iVar1 = strcmp(line + 0xff8,"[vdso]");
  } while (iVar1 != 0);
  close(addr_begin._4_4_);
  local_2048 = ___throw_regex_error;
  while( true ) {
    if (local_2048 == (link_map *)0x0) {
      return (link_map *)0x0;
    }
    if ((addr_end <= local_2048->l_ld) && (local_2048->l_ld < dynamic)) break;
    local_2048 = local_2048->l_next;
  }
  return local_2048;
}

Assistant:

struct link_map *get_vdso_from_maps() {
  int maps = 0, hit_eof = 0;
  ElfW(Addr) addr_begin = 0, addr_end = 0, dynamic = 0;
  char name[BUFFER_LEN] = {'\0'}, line[BUFFER_LEN] = {'\0'}, *line_pos = NULL;
  struct link_map *m = NULL;
  maps = gotcha_open("/proc/self/maps", O_RDONLY);
  for (;;) {
    hit_eof = read_line(line, BUFFER_LEN, maps);
    if (hit_eof) {
      gotcha_close(maps);  // GCOVR_EXCL_LINE
      return NULL;         // GCOVR_EXCL_LINE
    }
    line_pos = line;
    line_pos += read_hex(line_pos, &addr_begin);
    if (*line_pos != '-') continue;  // GCOVR_EXCL_LINE
    line_pos++;
    line_pos += read_hex(line_pos, &addr_end);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, name, sizeof(name));
    if (gotcha_strcmp(name, "[vdso]") == 0) {
      gotcha_close(maps);
      break;
    }
  }

  for (m = _r_debug.r_map; m; m = m->l_next) {
    dynamic = (ElfW(Addr))m->l_ld;
    if (dynamic >= addr_begin && dynamic < addr_end) return m;
  }

  return NULL;  // GCOVR_EXCL_LINE
}